

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  stbi__write_context *psVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 in_register_0000000c;
  char *fmt;
  void *pvVar6;
  undefined4 in_register_00000034;
  void *__s1;
  uchar *d;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  bool bVar11;
  uchar header_1;
  uchar header;
  undefined8 local_a8;
  int local_9c;
  ulong local_98;
  long local_90;
  char *local_88;
  ulong local_80;
  int local_74;
  void *local_70;
  long local_68;
  stbi__write_context *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  fmt = (char *)CONCAT44(in_register_00000034,x);
  local_a8 = CONCAT44(in_register_0000000c,comp);
  bVar11 = (comp - 2U & 0xfffffffd) == 0;
  uVar4 = (uint)bVar11;
  iVar7 = comp - uVar4;
  if ((y | x) < 0) {
    iVar7 = 0;
  }
  else {
    local_88 = fmt;
    local_70 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar7 = stbiw__outfile(s,x,0,x,y,comp,0,data,(uint)bVar11,0,"111 221 2222 11",0,0,
                             (ulong)(iVar7 < 2 | 2),0,0,0,0,0,fmt,(ulong)(uint)y,
                             (ulong)((iVar7 + uVar4) * 8),(ulong)((uint)bVar11 * 8));
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(s,fmt,0,0,(ulong)(iVar7 < 2 | 10),0,0,0,0,0,fmt,(ulong)(uint)y,
                    (ulong)((iVar7 + uVar4) * 8),(ulong)((uint)bVar11 * 8));
      if (0 < y) {
        local_9c = (int)local_a8 * x;
        local_74 = x + -1;
        __n = (size_t)(int)local_a8;
        lVar9 = (long)x;
        local_98 = (ulong)(uint)y;
        iVar7 = (y + -1) * local_9c;
        local_60 = s;
        local_58 = (ulong)bVar11;
        local_50 = lVar9;
        do {
          local_48 = local_98;
          local_98 = local_98 - 1;
          local_68 = (long)iVar7;
          if (0 < (int)fmt) {
            local_40 = (long)(local_9c * (int)local_98) + (long)local_70;
            local_90 = (long)local_70 + local_68;
            local_38 = 0;
            uVar8 = local_a8;
            do {
              iVar7 = (int)local_38;
              lVar10 = (long)(iVar7 * (int)uVar8);
              uVar5 = 1;
              if (iVar7 < local_74) {
                __s1 = (void *)(local_40 + lVar10);
                iVar3 = bcmp(__s1,(void *)((iVar7 + 1) * (int)local_a8 + local_40),__n);
                iVar7 = iVar7 + 2;
                if (iVar3 != 0) {
                  uVar5 = 2;
                  if (iVar7 < (int)fmt) {
                    lVar9 = (long)iVar7;
                    pvVar6 = (void *)(__n * lVar9 + local_90);
                    uVar5 = 1;
                    do {
                      lVar9 = lVar9 + 1;
                      iVar7 = bcmp(__s1,pvVar6,__n);
                      if (iVar7 == 0) goto LAB_00111ee1;
                      iVar7 = (int)uVar5;
                      uVar4 = iVar7 + 1;
                      uVar5 = (ulong)uVar4;
                      if (local_50 <= lVar9) break;
                      __s1 = (void *)((long)__s1 + __n);
                      pvVar6 = (void *)((long)pvVar6 + __n);
                    } while (uVar4 < 0x7f);
                    uVar5 = (ulong)(iVar7 + 2);
                  }
                  goto LAB_00111ee1;
                }
                uVar5 = 2;
                if (iVar7 < (int)fmt) {
                  lVar10 = (long)iVar7;
                  pvVar6 = (void *)(__n * lVar10 + local_90);
                  uVar4 = 2;
                  while( true ) {
                    lVar10 = lVar10 + 1;
                    iVar7 = bcmp(__s1,pvVar6,__n);
                    if (iVar7 != 0) break;
                    uVar5 = (ulong)(uVar4 + 1);
                    if ((lVar9 <= lVar10) ||
                       (pvVar6 = (void *)((long)pvVar6 + __n), bVar11 = 0x7e < uVar4,
                       uVar4 = uVar4 + 1, bVar11)) goto LAB_00111f5b;
                  }
                  uVar5 = (ulong)uVar4;
                }
LAB_00111f5b:
                psVar1 = local_60;
                header_1 = (char)uVar5 + '\x7f';
                local_80 = uVar5;
                (*local_60->func)(local_60->context,&header_1,1);
                uVar8 = local_a8;
                stbiw__write_pixel(psVar1,(int)local_a8,(int)local_58,0,(int)__s1,d);
              }
              else {
LAB_00111ee1:
                psVar1 = local_60;
                header = (char)uVar5 + 0xff;
                (*local_60->func)(local_60->context,&header,1);
                uVar2 = local_58;
                uVar8 = local_a8;
                lVar9 = local_50;
                local_80 = uVar5;
                if (0 < (int)uVar5) {
                  lVar10 = lVar10 + local_90;
                  do {
                    stbiw__write_pixel(psVar1,(int)uVar8,(int)uVar2,0,(int)lVar10,d);
                    lVar10 = lVar10 + __n;
                    uVar5 = uVar5 - 1;
                    lVar9 = local_50;
                  } while (uVar5 != 0);
                }
              }
              uVar4 = (int)local_80 + (int)local_38;
              local_38 = (ulong)uVar4;
              fmt = local_88;
            } while ((int)uVar4 < (int)local_88);
          }
          iVar7 = (int)local_68 - local_9c;
        } while (1 < (long)local_48);
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      for (j = y - 1; j >= 0; --j) {
          unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}